

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_decode.c
# Opt level: O0

void ihevcd_fill_outargs(codec_t *ps_codec,ivd_video_decode_ip_t *ps_dec_ip,
                        ivd_video_decode_op_t *ps_dec_op)

{
  int iVar1;
  undefined8 *puVar2;
  UWORD32 UVar3;
  long lVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  WORD32 diff;
  UWORD8 *pu1_v_dst;
  UWORD8 *pu1_u_dst;
  WORD32 i;
  UWORD32 u4_pic_struct;
  sei_params_t *ps_sei;
  pic_buf_t *ps_disp_buf;
  profile_tier_lvl_info_t *ps_ptl;
  sps_t *ps_sps;
  long local_50;
  long local_48;
  int local_40;
  
  UVar3 = ihevcd_map_error(*(IHEVCD_ERROR_T *)(in_RDI + 0x90));
  *(UWORD32 *)(in_RDX + 4) = UVar3;
  *(int *)(in_RDX + 8) = *(int *)(in_RSI + 0xc) - *(int *)(in_RDI + 0xac);
  if (*(int *)(in_RDI + 0x70) == 0) {
    *(undefined4 *)(in_RDX + 0xc) = 0;
    *(undefined4 *)(in_RDX + 0x10) = 0;
  }
  else {
    *(undefined4 *)(in_RDX + 0xc) = *(undefined4 *)(in_RDI + 8);
    *(undefined4 *)(in_RDX + 0x10) = *(undefined4 *)(in_RDI + 0xc);
  }
  *(undefined4 *)(in_RDX + 0x14) = *(undefined4 *)(in_RDI + 0x4c);
  *(undefined4 *)(in_RDX + 0x18) = *(undefined4 *)(in_RDI + 0x54);
  *(undefined4 *)(in_RDX + 0x1c) = 0;
  *(undefined4 *)(in_RDX + 0x20) = 0;
  *(undefined4 *)(in_RDX + 0x24) = 1;
  if (((*(int *)(in_RDI + 0x70) != 0) &&
      (lVar4 = *(long *)(in_RDI + 0x388) + (long)*(int *)(in_RDI + 0x3f30) * 0x20c8,
      *(char *)(lVar4 + 0xdf3) == '\0')) && (*(char *)(lVar4 + 0xdf4) == '\x01')) {
    *(undefined4 *)(in_RDX + 0x24) = 0;
  }
  *(undefined4 *)(in_RDX + 0x28) = 1;
  *(undefined4 *)(in_RDX + 0x2c) = *(undefined4 *)(in_RDI + 0x3c);
  *(undefined4 *)(in_RDX + 0x28) = 1;
  *(undefined4 *)(in_RDX + 0x78) = 0;
  *(undefined4 *)(in_RDX + 0x7c) = 0xffffffff;
  *(undefined4 *)(in_RDX + 0x80) = *(undefined4 *)(in_RDI + 0x168);
  if (*(int *)(in_RDI + 100) != 0) {
    *(undefined4 *)(in_RDX + 8) = 0;
    *(undefined4 *)(in_RDX + 0x28) = 0;
    *(undefined4 *)(in_RDX + 0x14) = 0x7fffffff;
    *(undefined4 *)(in_RDX + 0x18) = 0;
  }
  if (*(long *)(in_RDI + 0x170) == 0) {
    if (*(int *)(in_RDI + 100) == 0) {
      return;
    }
    *(undefined4 *)(in_RDX + 4) = 0xd7;
    *(undefined4 *)(in_RDI + 100) = 0;
    return;
  }
  puVar2 = *(undefined8 **)(in_RDI + 0x170);
  if ((*(char *)((long)puVar2 + 0x24) == '\0') || (*(char *)((long)puVar2 + 0x27) == '\0'))
  goto LAB_00114ef8;
  iVar1 = *(int *)(puVar2 + 0x8c);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      *(undefined4 *)(in_RDX + 0x78) = 0;
      *(undefined4 *)(in_RDX + 0x24) = 0;
      goto LAB_00114ef8;
    }
    if (iVar1 == 2) {
      *(undefined4 *)(in_RDX + 0x78) = 1;
      *(undefined4 *)(in_RDX + 0x24) = 0;
      goto LAB_00114ef8;
    }
  }
  *(undefined4 *)(in_RDX + 0x78) = 0;
  *(undefined4 *)(in_RDX + 0x24) = 1;
LAB_00114ef8:
  *(undefined4 *)(in_RDX + 0x20) = 1;
  *(undefined4 *)(in_RDX + 0x7c) = *(undefined4 *)(puVar2 + 3);
  if ((*(int *)(in_RDI + 100) == 0) && (*(int *)(in_RDI + 0x4f8) == 0)) {
    *(undefined4 *)(in_RDX + 0x20) = 0;
  }
  *(undefined4 *)(in_RDX + 0x50) = *(undefined4 *)(in_RDI + 8);
  *(undefined4 *)(in_RDX + 0x54) = *(undefined4 *)(in_RDI + 0xc);
  if (*(int *)(in_RDI + 0x38) == 0) {
    *(undefined8 *)(in_RDX + 0x38) = *(undefined8 *)(in_RSI + 0x20);
    *(undefined8 *)(in_RDX + 0x40) = *(undefined8 *)(in_RSI + 0x28);
    *(undefined8 *)(in_RDX + 0x48) = *(undefined8 *)(in_RSI + 0x30);
    *(undefined4 *)(in_RDX + 0x58) = *(undefined4 *)(in_RDI + 0x10);
  }
  else {
    *(undefined8 *)(in_RDX + 0x38) = *puVar2;
    if (*(int *)(in_RDI + 0x3c) == 1) {
      local_48 = 0;
      local_50 = 0;
      for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x106b0); local_40 = local_40 + 1) {
        if ((int)*puVar2 - (int)*(undefined8 *)(in_RDI + (long)local_40 * 0x308 + 0x44b8) ==
            *(int *)(in_RDI + 0x14) * 0x50 + 0x50) {
          local_48 = *(long *)(in_RDI + (long)local_40 * 0x308 + 0x44c0) +
                     (long)((*(int *)(in_RDI + 0x14) * 0x50) / 4 + 0x28);
          local_50 = *(long *)(in_RDI + (long)local_40 * 0x308 + 0x44c8) +
                     (long)((*(int *)(in_RDI + 0x14) * 0x50) / 4 + 0x28);
          break;
        }
      }
      *(long *)(in_RDX + 0x40) = local_48;
      *(long *)(in_RDX + 0x48) = local_50;
    }
    else {
      *(undefined8 *)(in_RDX + 0x40) = puVar2[1];
      *(undefined8 *)(in_RDX + 0x48) = 0;
    }
    *(undefined4 *)(in_RDX + 0x58) = *(undefined4 *)(in_RDI + 0x14);
  }
  if ((*(int *)(in_RDI + 0x3c) == 0xc) || (*(int *)(in_RDI + 0x3c) == 0xb)) {
    *(undefined4 *)(in_RDX + 100) = *(undefined4 *)(in_RDX + 0x58);
    *(undefined4 *)(in_RDX + 0x70) = 0;
    *(undefined4 *)(in_RDX + 0x5c) = *(undefined4 *)(in_RDX + 0x50);
    *(undefined4 *)(in_RDX + 0x68) = 0;
    *(uint *)(in_RDX + 0x60) = *(uint *)(in_RDX + 0x54) >> 1;
    *(undefined4 *)(in_RDX + 0x6c) = 0;
  }
  else if (*(int *)(in_RDI + 0x3c) == 1) {
    *(uint *)(in_RDX + 100) = *(uint *)(in_RDX + 0x58) >> 1;
    *(uint *)(in_RDX + 0x70) = *(uint *)(in_RDX + 0x58) >> 1;
    *(uint *)(in_RDX + 0x5c) = *(uint *)(in_RDX + 0x50) >> 1;
    *(uint *)(in_RDX + 0x68) = *(uint *)(in_RDX + 0x50) >> 1;
    *(uint *)(in_RDX + 0x60) = *(uint *)(in_RDX + 0x54) >> 1;
    *(uint *)(in_RDX + 0x6c) = *(uint *)(in_RDX + 0x54) >> 1;
  }
  return;
}

Assistant:

static void ihevcd_fill_outargs(codec_t *ps_codec,
                                ivd_video_decode_ip_t *ps_dec_ip,
                                ivd_video_decode_op_t *ps_dec_op)
{

    ps_dec_op->u4_error_code = ihevcd_map_error((IHEVCD_ERROR_T)ps_codec->i4_error_code);
    ps_dec_op->u4_num_bytes_consumed = ps_dec_ip->u4_num_Bytes
                    - ps_codec->i4_bytes_remaining;
    if(ps_codec->i4_sps_done)
    {
        ps_dec_op->u4_pic_wd = ps_codec->i4_disp_wd;
        ps_dec_op->u4_pic_ht = ps_codec->i4_disp_ht;
    }
    else
    {
        ps_dec_op->u4_pic_wd = 0;
        ps_dec_op->u4_pic_ht = 0;
    }

    ps_dec_op->e_pic_type = ps_codec->e_dec_pic_type;
    ps_dec_op->u4_frame_decoded_flag = ps_codec->i4_pic_present;
    ps_dec_op->u4_new_seq = 0;

    ps_dec_op->u4_output_present = 0;
    ps_dec_op->u4_progressive_frame_flag = 1;
    if(ps_codec->i4_sps_done)
    {
        sps_t *ps_sps = (ps_codec->s_parse.ps_sps_base + ps_codec->i4_sps_id);
        profile_tier_lvl_info_t *ps_ptl;
        ps_ptl = &ps_sps->s_ptl;
        if((0 == ps_ptl->s_ptl_gen.i1_general_progressive_source_flag) &&
           (1 == ps_ptl->s_ptl_gen.i1_general_interlaced_source_flag))
        {
            ps_dec_op->u4_progressive_frame_flag = 0;
        }
    }

    ps_dec_op->u4_is_ref_flag = 1;
    ps_dec_op->e_output_format = ps_codec->e_chroma_fmt;
    ps_dec_op->u4_is_ref_flag = 1;

    ps_dec_op->e4_fld_type = IV_FLD_TYPE_DEFAULT;

    ps_dec_op->u4_ts = (UWORD32)(-1);
    ps_dec_op->u4_disp_buf_id = ps_codec->i4_disp_buf_id;
    if(ps_codec->i4_flush_mode)
    {
        ps_dec_op->u4_num_bytes_consumed = 0;
        /*In the case of flush ,since no frame is decoded set pic type as invalid*/
        ps_dec_op->u4_is_ref_flag = 0;
        ps_dec_op->e_pic_type = IV_NA_FRAME;
        ps_dec_op->u4_frame_decoded_flag = 0;

    }
    /* If there is a display buffer */
    if(ps_codec->ps_disp_buf)
    {
        pic_buf_t *ps_disp_buf = ps_codec->ps_disp_buf;
        sei_params_t *ps_sei = &ps_disp_buf->s_sei_params;

        if(ps_sei->i1_sei_parameters_present_flag &&
           ps_sei->i1_pic_timing_params_present_flag)
        {
            UWORD32 u4_pic_struct;
            u4_pic_struct = ps_sei->s_pic_timing_sei_params.u4_pic_struct;
            switch(u4_pic_struct)
            {
                case 1:
                    ps_dec_op->e4_fld_type = IV_TOP_FLD;
                    ps_dec_op->u4_progressive_frame_flag = 0;
                    break;
                case 2:
                    ps_dec_op->e4_fld_type = IV_BOT_FLD;
                    ps_dec_op->u4_progressive_frame_flag = 0;
                    break;
                case 0:
                default:
                    ps_dec_op->e4_fld_type = IV_FLD_TYPE_DEFAULT;
                    ps_dec_op->u4_progressive_frame_flag = 1;
                    break;
            }
        }
        ps_dec_op->u4_output_present = 1;
        ps_dec_op->u4_ts = ps_disp_buf->u4_ts;
        if((ps_codec->i4_flush_mode == 0) && (ps_codec->s_parse.i4_end_of_frame == 0))
            ps_dec_op->u4_output_present = 0;
        ps_dec_op->s_disp_frm_buf.u4_y_wd = ps_codec->i4_disp_wd;
        ps_dec_op->s_disp_frm_buf.u4_y_ht = ps_codec->i4_disp_ht;

        if(ps_codec->i4_share_disp_buf)
        {
            ps_dec_op->s_disp_frm_buf.pv_y_buf = ps_disp_buf->pu1_luma;
            if(ps_codec->e_chroma_fmt != IV_YUV_420P)
            {
                ps_dec_op->s_disp_frm_buf.pv_u_buf = ps_disp_buf->pu1_chroma;
                ps_dec_op->s_disp_frm_buf.pv_v_buf = NULL;
            }
            else
            {
                WORD32 i;
                UWORD8 *pu1_u_dst = NULL, *pu1_v_dst = NULL;
                for(i = 0; i < ps_codec->i4_share_disp_buf_cnt; i++)
                {
                    WORD32 diff = ps_disp_buf->pu1_luma - ps_codec->s_disp_buffer[i].pu1_bufs[0];
                    if(diff == (ps_codec->i4_strd * PAD_TOP + PAD_LEFT))
                    {
                        pu1_u_dst = ps_codec->s_disp_buffer[i].pu1_bufs[1];
                        pu1_u_dst += (ps_codec->i4_strd * PAD_TOP) / 4 + (PAD_LEFT / 2);

                        pu1_v_dst = ps_codec->s_disp_buffer[i].pu1_bufs[2];
                        pu1_v_dst += (ps_codec->i4_strd * PAD_TOP) / 4 + (PAD_LEFT / 2);
                        break;
                    }
                }
                ps_dec_op->s_disp_frm_buf.pv_u_buf = pu1_u_dst;
                ps_dec_op->s_disp_frm_buf.pv_v_buf = pu1_v_dst;
            }
            ps_dec_op->s_disp_frm_buf.u4_y_strd = ps_codec->i4_strd;
        }
        else
        {
            ps_dec_op->s_disp_frm_buf.pv_y_buf =
                            ps_dec_ip->s_out_buffer.pu1_bufs[0];
            ps_dec_op->s_disp_frm_buf.pv_u_buf =
                            ps_dec_ip->s_out_buffer.pu1_bufs[1];
            ps_dec_op->s_disp_frm_buf.pv_v_buf =
                            ps_dec_ip->s_out_buffer.pu1_bufs[2];
            ps_dec_op->s_disp_frm_buf.u4_y_strd = ps_codec->i4_disp_strd;
        }

        if((IV_YUV_420SP_VU == ps_codec->e_chroma_fmt)
                        || (IV_YUV_420SP_UV == ps_codec->e_chroma_fmt))
        {
            ps_dec_op->s_disp_frm_buf.u4_u_strd =
                            ps_dec_op->s_disp_frm_buf.u4_y_strd;
            ps_dec_op->s_disp_frm_buf.u4_v_strd = 0;
            ps_dec_op->s_disp_frm_buf.u4_u_wd =
                            ps_dec_op->s_disp_frm_buf.u4_y_wd;
            ps_dec_op->s_disp_frm_buf.u4_v_wd = 0;
            ps_dec_op->s_disp_frm_buf.u4_u_ht =
                            ps_dec_op->s_disp_frm_buf.u4_y_ht / 2;
            ps_dec_op->s_disp_frm_buf.u4_v_ht = 0;
        }
        else if(IV_YUV_420P == ps_codec->e_chroma_fmt)
        {
            ps_dec_op->s_disp_frm_buf.u4_u_strd =
                            ps_dec_op->s_disp_frm_buf.u4_y_strd / 2;
            ps_dec_op->s_disp_frm_buf.u4_v_strd =
                            ps_dec_op->s_disp_frm_buf.u4_y_strd / 2;
            ps_dec_op->s_disp_frm_buf.u4_u_wd =
                            ps_dec_op->s_disp_frm_buf.u4_y_wd / 2;
            ps_dec_op->s_disp_frm_buf.u4_v_wd =
                            ps_dec_op->s_disp_frm_buf.u4_y_wd / 2;
            ps_dec_op->s_disp_frm_buf.u4_u_ht =
                            ps_dec_op->s_disp_frm_buf.u4_y_ht / 2;
            ps_dec_op->s_disp_frm_buf.u4_v_ht =
                            ps_dec_op->s_disp_frm_buf.u4_y_ht / 2;
        }

    }
    else if(ps_codec->i4_flush_mode)
    {
        ps_dec_op->u4_error_code = IHEVCD_END_OF_SEQUENCE;
        /* Come out of flush mode */
        ps_codec->i4_flush_mode = 0;
    }

}